

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni2name.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeNameTransliterator::UnicodeNameTransliterator
          (UnicodeNameTransliterator *this,UnicodeFilter *adoptedFilter)

{
  ConstChar16Ptr local_68 [3];
  UnicodeString local_50;
  
  local_68[0].p_ = L"Any-Name";
  icu_63::UnicodeString::UnicodeString(&local_50,'\x01',local_68,8);
  Transliterator::Transliterator(&this->super_Transliterator,&local_50,adoptedFilter);
  icu_63::UnicodeString::~UnicodeString(&local_50);
  (this->super_Transliterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeNameTransliterator_0045ff78;
  return;
}

Assistant:

UnicodeNameTransliterator::UnicodeNameTransliterator(UnicodeFilter* adoptedFilter) :
    Transliterator(UNICODE_STRING("Any-Name", 8), adoptedFilter) {
}